

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O1

int __thiscall
NoMeEdgeCalculator::pairedReadDetermination
          (NoMeEdgeCalculator *this,AlignmentRecord *ar1,AlignmentRecord *ar2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = AlignmentRecord::getEnd1(ar1);
  uVar2 = AlignmentRecord::getStart2(ar2);
  if (uVar1 < uVar2) {
    uVar1 = AlignmentRecord::getStart2(ar1);
    uVar2 = AlignmentRecord::getEnd1(ar2);
    if (uVar2 < uVar1) {
      return 1;
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar1);
  uVar2 = AlignmentRecord::getStart2(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar2 <= uVar1) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar2 <= uVar1) {
          return 2;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar1);
  uVar2 = AlignmentRecord::getStart2(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar2 <= uVar1) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar1 < uVar2) {
          return 3;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar2);
  uVar2 = AlignmentRecord::getStart2(ar1);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar1 < uVar2) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar2 <= uVar1) {
          return 4;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart2(ar1);
  uVar2 = AlignmentRecord::getStart1(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar1 < uVar2) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar2 <= uVar1) {
          return 5;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar1);
  uVar2 = AlignmentRecord::getStart1(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getStart1(ar1);
    uVar2 = AlignmentRecord::getEnd1(ar2);
    if (uVar1 <= uVar2) {
      uVar1 = AlignmentRecord::getEnd1(ar1);
      uVar2 = AlignmentRecord::getStart2(ar2);
      if (uVar2 <= uVar1) {
        uVar1 = AlignmentRecord::getStart2(ar1);
        uVar2 = AlignmentRecord::getEnd2(ar2);
        if (uVar1 <= uVar2) {
          return 6;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar1);
  uVar2 = AlignmentRecord::getStart1(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getStart2(ar1);
    uVar2 = AlignmentRecord::getEnd2(ar2);
    if (uVar2 < uVar1) {
      uVar1 = AlignmentRecord::getEnd1(ar1);
      uVar2 = AlignmentRecord::getStart2(ar2);
      if (uVar2 <= uVar1) {
        uVar1 = AlignmentRecord::getStart1(ar1);
        uVar2 = AlignmentRecord::getEnd1(ar2);
        if (uVar1 <= uVar2) {
          return 7;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar2);
  uVar2 = AlignmentRecord::getStart1(ar1);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar2 <= uVar1) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar2 <= uVar1) {
          return 8;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar2);
  uVar2 = AlignmentRecord::getStart1(ar1);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar1);
    uVar2 = AlignmentRecord::getStart1(ar2);
    if (uVar2 <= uVar1) {
      uVar1 = AlignmentRecord::getStart2(ar1);
      uVar2 = AlignmentRecord::getEnd1(ar2);
      if (uVar1 <= uVar2) {
        uVar1 = AlignmentRecord::getEnd2(ar1);
        uVar2 = AlignmentRecord::getStart2(ar2);
        if (uVar1 < uVar2) {
          return 9;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar1);
  uVar2 = AlignmentRecord::getStart2(ar2);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getStart1(ar1);
    uVar2 = AlignmentRecord::getEnd1(ar2);
    if (uVar2 < uVar1) {
      uVar1 = AlignmentRecord::getEnd1(ar1);
      uVar2 = AlignmentRecord::getStart2(ar2);
      if (uVar2 <= uVar1) {
        uVar1 = AlignmentRecord::getStart2(ar1);
        uVar2 = AlignmentRecord::getEnd2(ar2);
        if (uVar1 <= uVar2) {
          return 10;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart2(ar2);
  uVar2 = AlignmentRecord::getStart1(ar1);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getEnd1(ar2);
    uVar2 = AlignmentRecord::getStart1(ar1);
    if (uVar1 < uVar2) {
      uVar1 = AlignmentRecord::getEnd1(ar1);
      uVar2 = AlignmentRecord::getStart2(ar2);
      if (uVar2 <= uVar1) {
        uVar1 = AlignmentRecord::getStart2(ar1);
        uVar2 = AlignmentRecord::getEnd2(ar2);
        if (uVar1 <= uVar2) {
          return 0xb;
        }
      }
    }
  }
  uVar1 = AlignmentRecord::getStart1(ar2);
  uVar2 = AlignmentRecord::getStart1(ar1);
  if (uVar1 <= uVar2) {
    uVar1 = AlignmentRecord::getStart1(ar1);
    uVar2 = AlignmentRecord::getEnd1(ar2);
    if (uVar1 <= uVar2) {
      uVar1 = AlignmentRecord::getEnd1(ar1);
      uVar2 = AlignmentRecord::getStart2(ar2);
      if (uVar2 <= uVar1) {
        uVar1 = AlignmentRecord::getStart2(ar1);
        uVar2 = AlignmentRecord::getEnd2(ar2);
        if (uVar1 <= uVar2) {
          return 0xc;
        }
      }
    }
  }
  AlignmentRecord::getStart1(ar2);
  AlignmentRecord::getStart1(ar1);
  AlignmentRecord::getStart2(ar1);
  AlignmentRecord::getEnd2(ar2);
  AlignmentRecord::getStart1(ar1);
  AlignmentRecord::getEnd1(ar2);
  AlignmentRecord::getEnd1(ar1);
  AlignmentRecord::getStart2(ar2);
  return 0xd;
}

Assistant:

int NoMeEdgeCalculator::pairedReadDetermination(const AlignmentRecord& ar1, const AlignmentRecord& ar2)const{

    // --------    |  -----------    <-ar1
    //   --------  |     ----------

    if(ar1.getEnd1() < ar2.getStart2() && ar1.getStart2() > ar2.getEnd1()){
        return 1;
    }//----------    ------------   <-ar1
    //    ---------------   -----------
    else if(ar1.getStart1() <= ar2.getStart2() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 2;

   } //-----------       ----------- <-ar1
    //    -----------------               -----------
    else if(ar1.getStart1() <= ar2.getStart2() && ar1.getEnd1() >=ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() < ar2.getStart2()){
        return 3;
   } //----------        ------------  <- ar1
    //                --------    ----------
    else if(ar2.getStart1() <= ar1.getStart2() && ar1.getEnd1() < ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 4;
    } //--------      --------- <-ar1
      //                --  -----------
    else if(ar1.getStart2() <= ar2.getStart1() && ar1.getEnd1() < ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2() ){
        return 5;
    } // -------------     ----------- <-ar1
        //   ----  ---------------
    else if(ar1.getStart1() <= ar2.getStart1() &&ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){\
        return 6;
    } //----------         -----------  <-ar1
     //  ----   -------
    else if(ar1.getStart1() <= ar2.getStart1() && ar1.getStart2() > ar2.getEnd2() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart1() <= ar2.getEnd1()){
        return 7;
    } //   ------   -----------   <-ar1
    //----------------  ----------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() >= ar2.getStart2()){
        return 8;
    } //      ----    --------- <-ar1
      //------------------          --------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getEnd1() >= ar2.getStart1() && ar1.getStart2() <= ar2.getEnd1() && ar1.getEnd2() < ar2.getStart2()){
        return 9;

    } //                -------    ------- <-ar1
      //-------------       ------------
      else if(ar1.getStart1() <= ar2.getStart2() && ar1.getStart1() > ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 10;
    } //                   ---   -------- <-ar1
      //-------------     -----------
     else if(ar2.getStart2() <= ar1.getStart1() && ar2.getEnd1()<ar1.getStart1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 11;
    }
       //  --------    ------------  <-ar1
       //-----    ----------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2() && ar1.getStart2() <= ar2.getEnd2()){
        return 12;
    } //   --------------                 -------------- <-ar1
      //----------     -------------
      else if(ar2.getStart1() <= ar1.getStart1() && ar1.getStart2() > ar2.getEnd2() && ar1.getStart1() <= ar2.getEnd1() && ar1.getEnd1() >= ar2.getStart2()){
        return 13;
    }
}